

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::readArray(OurReader *this,Token *tokenStart)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  int index;
  allocator local_91;
  Token endArray;
  Token token;
  Value init;
  
  Value::Value(&init,arrayValue);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar2[-1],&init);
  ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar2 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  ppVVar2[-1]->start_ = (long)tokenStart->start_ - (long)this->begin_;
  skipSpaces(this);
  if (*this->current_ == ']') {
    readToken(this,&endArray);
LAB_0010d13d:
    bVar1 = true;
  }
  else {
    index = 0;
    do {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (ppVVar2 ==
          (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      endArray._0_8_ = Value::operator[](ppVVar2[-1],index);
      std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,(Value **)&endArray);
      bVar1 = readValue(this);
      std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
      if (!bVar1) {
        recoverFromError(this,tokenArrayEnd);
        goto LAB_0010d208;
      }
      readToken(this,&token);
      index = index + 1;
      while (token.type_ == tokenComment) {
        readToken(this,&token);
      }
      if (token.type_ == tokenArrayEnd) goto LAB_0010d13d;
    } while (token.type_ == tokenArraySeparator);
    std::__cxx11::string::string
              ((string *)&endArray,"Missing \',\' or \']\' in array declaration",&local_91);
    addErrorAndRecover(this,(string *)&endArray,&token,tokenArrayEnd);
    std::__cxx11::string::~string((string *)&endArray);
LAB_0010d208:
    bVar1 = false;
  }
  Value::~Value(&init);
  return bVar1;
}

Assistant:

bool OurReader::readArray(Token& tokenStart) {
  Value init(arrayValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(tokenStart.start_ - begin_);
  skipSpaces();
  if (*current_ == ']') // empty array
  {
    Token endArray;
    readToken(endArray);
    return true;
  }
  int index = 0;
  for (;;) {
    Value& value = currentValue()[index++];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenArrayEnd);

    Token token;
    // Accept Comment after last item in the array.
    ok = readToken(token);
    while (token.type_ == tokenComment && ok) {
      ok = readToken(token);
    }
    bool badTokenType =
        (token.type_ != tokenArraySeparator && token.type_ != tokenArrayEnd);
    if (!ok || badTokenType) {
      return addErrorAndRecover(
          "Missing ',' or ']' in array declaration", token, tokenArrayEnd);
    }
    if (token.type_ == tokenArrayEnd)
      break;
  }
  return true;
}